

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O3

void __thiscall
covec::Covec<float>::
Covec<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (Covec<float> *this,
          vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          *probs,mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *gen,size_t dim,float sigma,size_t neg_size,float eta0,float eta1,
          bool enable_chopout,vector<unsigned_long,_std::allocator<unsigned_long>_> *share)

{
  this->neg_size_ = 0;
  this->eta0_ = 0.0;
  this->eta1_ = 0.0;
  (this->num_entries_).
  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dim_ = 0;
  (this->num_entries_).
  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_entries_).
  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->chopout_enabled_ = false;
  (this->keep_dim_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keep_dim_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keep_dim_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->probs_).
  super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->probs_).
  super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->probs_).
  super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vs_).
  super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vs_).
  super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vs_).
  super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cs_).
  super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cs_).
  super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cs_).
  super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->share_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->share_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->share_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initialize<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (this,probs,gen,dim,sigma,neg_size,eta0,eta1,enable_chopout,share);
  return;
}

Assistant:

Covec(const std::vector<std::shared_ptr<std::discrete_distribution<int> > >& probs,
          RandomGenerator& gen,
          const std::size_t dim = 128,
          const Real sigma = 1.0e-1,
          const std::size_t neg_size = 1,
          const Real eta0 = 5e-3, // learning rate
          const Real eta1 = 1e-5, // final learning rate
	  const bool enable_chopout = false,  // enable_chopout or not
          const std::vector<std::size_t>& share = std::vector<std::size_t>() // put indices to share parameters          
          )
      : num_entries_(), dim_(), neg_size_(), eta0_(), eta1_(), chopout_enabled_(), keep_dim_()
      , vs_(), cs_(), share_()
    { this->initialize(probs, gen, dim, sigma, neg_size, eta0, eta1, enable_chopout, share); }